

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcarith.c
# Opt level: O0

void start_pass(j_decompress_ptr cinfo)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  long lVar4;
  undefined8 uVar5;
  long *in_RDI;
  int expected;
  int *prev_coef_bit_ptr;
  int *coef_bit_ptr;
  int cindex;
  int coefi;
  jpeg_component_info *compptr;
  int tbl;
  int ci;
  arith_entropy_ptr_conflict entropy;
  int local_4c;
  int local_48;
  int local_40;
  int local_24;
  int local_14;
  
  lVar2 = in_RDI[0x4a];
  if ((int)in_RDI[0x27] == 0) {
    if ((((*(int *)((long)in_RDI + 0x20c) != 0) || (*(int *)((long)in_RDI + 0x214) != 0)) ||
        ((int)in_RDI[0x43] != 0)) || (((int)in_RDI[0x42] < 0x40 && ((int)in_RDI[0x42] != 0x3f)))) {
      *(undefined4 *)(*in_RDI + 0x28) = 0x7a;
      (**(code **)(*in_RDI + 8))(in_RDI);
    }
    *(code **)(lVar2 + 8) = decode_mcu;
    goto LAB_0011bef6;
  }
  if (*(int *)((long)in_RDI + 0x20c) == 0) {
    if ((int)in_RDI[0x42] != 0) goto LAB_0011bb13;
LAB_0011bad6:
    if (((*(int *)((long)in_RDI + 0x214) != 0) &&
        (*(int *)((long)in_RDI + 0x214) + -1 != (int)in_RDI[0x43])) || (0xd < (int)in_RDI[0x43]))
    goto LAB_0011bb13;
  }
  else {
    if (((*(int *)((long)in_RDI + 0x20c) <= (int)in_RDI[0x42]) && ((int)in_RDI[0x42] < 0x40)) &&
       ((int)in_RDI[0x36] == 1)) goto LAB_0011bad6;
LAB_0011bb13:
    *(undefined4 *)(*in_RDI + 0x28) = 0x10;
    *(undefined4 *)(*in_RDI + 0x2c) = *(undefined4 *)((long)in_RDI + 0x20c);
    *(int *)(*in_RDI + 0x30) = (int)in_RDI[0x42];
    *(undefined4 *)(*in_RDI + 0x34) = *(undefined4 *)((long)in_RDI + 0x214);
    *(int *)(*in_RDI + 0x38) = (int)in_RDI[0x43];
    (**(code **)*in_RDI)(in_RDI);
  }
  for (local_14 = 0; local_14 < (int)in_RDI[0x36]; local_14 = local_14 + 1) {
    iVar1 = *(int *)(in_RDI[(long)local_14 + 0x37] + 4);
    piVar3 = (int *)(in_RDI[0x18] + (long)iVar1 * 0x100);
    lVar4 = in_RDI[0x18] + (long)(iVar1 + (int)in_RDI[7]) * 0x100;
    if ((*(int *)((long)in_RDI + 0x20c) != 0) && (*piVar3 < 0)) {
      *(undefined4 *)(*in_RDI + 0x28) = 0x73;
      *(int *)(*in_RDI + 0x2c) = iVar1;
      *(undefined4 *)(*in_RDI + 0x30) = 0;
      (**(code **)(*in_RDI + 8))(in_RDI);
    }
    if (*(int *)((long)in_RDI + 0x20c) < 1) {
      local_40 = *(int *)((long)in_RDI + 0x20c);
    }
    else {
      local_40 = 1;
    }
    local_24 = local_40;
    while( true ) {
      if ((int)in_RDI[0x42] < 10) {
        local_48 = 9;
      }
      else {
        local_48 = (int)in_RDI[0x42];
      }
      if (local_48 < local_24) break;
      if (*(int *)((long)in_RDI + 0xac) < 2) {
        *(undefined4 *)(lVar4 + (long)local_24 * 4) = 0;
      }
      else {
        *(int *)(lVar4 + (long)local_24 * 4) = piVar3[local_24];
      }
      local_24 = local_24 + 1;
    }
    for (local_24 = *(int *)((long)in_RDI + 0x20c); local_24 <= (int)in_RDI[0x42];
        local_24 = local_24 + 1) {
      if (piVar3[local_24] < 0) {
        local_4c = 0;
      }
      else {
        local_4c = piVar3[local_24];
      }
      if (*(int *)((long)in_RDI + 0x214) != local_4c) {
        *(undefined4 *)(*in_RDI + 0x28) = 0x73;
        *(int *)(*in_RDI + 0x2c) = iVar1;
        *(int *)(*in_RDI + 0x30) = local_24;
        (**(code **)(*in_RDI + 8))(in_RDI);
      }
      piVar3[local_24] = (int)in_RDI[0x43];
    }
  }
  if (*(int *)((long)in_RDI + 0x214) == 0) {
    if (*(int *)((long)in_RDI + 0x20c) == 0) {
      *(code **)(lVar2 + 8) = decode_mcu_DC_first;
    }
    else {
      *(code **)(lVar2 + 8) = decode_mcu_AC_first;
    }
  }
  else if (*(int *)((long)in_RDI + 0x20c) == 0) {
    *(code **)(lVar2 + 8) = decode_mcu_DC_refine;
  }
  else {
    *(code **)(lVar2 + 8) = decode_mcu_AC_refine;
  }
LAB_0011bef6:
  for (local_14 = 0; local_14 < (int)in_RDI[0x36]; local_14 = local_14 + 1) {
    lVar4 = in_RDI[(long)local_14 + 0x37];
    if (((int)in_RDI[0x27] == 0) ||
       ((*(int *)((long)in_RDI + 0x20c) == 0 && (*(int *)((long)in_RDI + 0x214) == 0)))) {
      iVar1 = *(int *)(lVar4 + 0x14);
      if ((iVar1 < 0) || (0xf < iVar1)) {
        *(undefined4 *)(*in_RDI + 0x28) = 0x7d;
        *(int *)(*in_RDI + 0x2c) = iVar1;
        (**(code **)*in_RDI)(in_RDI);
      }
      if (*(long *)(lVar2 + 0x50 + (long)iVar1 * 8) == 0) {
        uVar5 = (**(code **)in_RDI[1])(in_RDI,1,0x40);
        *(undefined8 *)(lVar2 + 0x50 + (long)iVar1 * 8) = uVar5;
      }
      memset(*(void **)(lVar2 + 0x50 + (long)iVar1 * 8),0,0x40);
      *(undefined4 *)(lVar2 + 0x2c + (long)local_14 * 4) = 0;
      *(undefined4 *)(lVar2 + 0x3c + (long)local_14 * 4) = 0;
    }
    if (((int)in_RDI[0x27] == 0) || (*(int *)((long)in_RDI + 0x20c) != 0)) {
      iVar1 = *(int *)(lVar4 + 0x18);
      if ((iVar1 < 0) || (0xf < iVar1)) {
        *(undefined4 *)(*in_RDI + 0x28) = 0x7d;
        *(int *)(*in_RDI + 0x2c) = iVar1;
        (**(code **)*in_RDI)(in_RDI);
      }
      if (*(long *)(lVar2 + 0xd0 + (long)iVar1 * 8) == 0) {
        uVar5 = (**(code **)in_RDI[1])(in_RDI,1,0x100);
        *(undefined8 *)(lVar2 + 0xd0 + (long)iVar1 * 8) = uVar5;
      }
      memset(*(void **)(lVar2 + 0xd0 + (long)iVar1 * 8),0,0x100);
    }
  }
  *(undefined8 *)(lVar2 + 0x18) = 0;
  *(undefined8 *)(lVar2 + 0x20) = 0;
  *(undefined4 *)(lVar2 + 0x28) = 0xfffffff0;
  *(undefined4 *)(lVar2 + 0x10) = 0;
  *(int *)(lVar2 + 0x4c) = (int)in_RDI[0x2e];
  return;
}

Assistant:

METHODDEF(void)
start_pass(j_compress_ptr cinfo, boolean gather_statistics)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr)cinfo->entropy;
  int ci, tbl;
  jpeg_component_info *compptr;

  if (gather_statistics)
    /* Make sure to avoid that in the master control logic!
     * We are fully adaptive here and need no extra
     * statistics gathering pass!
     */
    ERREXIT(cinfo, JERR_NOT_COMPILED);

  /* We assume jcmaster.c already validated the progressive scan parameters. */

  /* Select execution routines */
  if (cinfo->progressive_mode) {
    if (cinfo->Ah == 0) {
      if (cinfo->Ss == 0)
        entropy->pub.encode_mcu = encode_mcu_DC_first;
      else
        entropy->pub.encode_mcu = encode_mcu_AC_first;
    } else {
      if (cinfo->Ss == 0)
        entropy->pub.encode_mcu = encode_mcu_DC_refine;
      else
        entropy->pub.encode_mcu = encode_mcu_AC_refine;
    }
  } else
    entropy->pub.encode_mcu = encode_mcu;

  /* Allocate & initialize requested statistics areas */
  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    compptr = cinfo->cur_comp_info[ci];
    /* DC needs no table for refinement scan */
    if (cinfo->progressive_mode == 0 || (cinfo->Ss == 0 && cinfo->Ah == 0)) {
      tbl = compptr->dc_tbl_no;
      if (tbl < 0 || tbl >= NUM_ARITH_TBLS)
        ERREXIT1(cinfo, JERR_NO_ARITH_TABLE, tbl);
      if (entropy->dc_stats[tbl] == NULL)
        entropy->dc_stats[tbl] = (unsigned char *)(*cinfo->mem->alloc_small)
          ((j_common_ptr)cinfo, JPOOL_IMAGE, DC_STAT_BINS);
      MEMZERO(entropy->dc_stats[tbl], DC_STAT_BINS);
      /* Initialize DC predictions to 0 */
      entropy->last_dc_val[ci] = 0;
      entropy->dc_context[ci] = 0;
    }
    /* AC needs no table when not present */
    if (cinfo->progressive_mode == 0 || cinfo->Se) {
      tbl = compptr->ac_tbl_no;
      if (tbl < 0 || tbl >= NUM_ARITH_TBLS)
        ERREXIT1(cinfo, JERR_NO_ARITH_TABLE, tbl);
      if (entropy->ac_stats[tbl] == NULL)
        entropy->ac_stats[tbl] = (unsigned char *)(*cinfo->mem->alloc_small)
          ((j_common_ptr)cinfo, JPOOL_IMAGE, AC_STAT_BINS);
      MEMZERO(entropy->ac_stats[tbl], AC_STAT_BINS);
#ifdef CALCULATE_SPECTRAL_CONDITIONING
      if (cinfo->progressive_mode)
        /* Section G.1.3.2: Set appropriate arithmetic conditioning value Kx */
        cinfo->arith_ac_K[tbl] = cinfo->Ss +
                                 ((8 + cinfo->Se - cinfo->Ss) >> 4);
#endif
    }
  }

  /* Initialize arithmetic encoding variables */
  entropy->c = 0;
  entropy->a = 0x10000L;
  entropy->sc = 0;
  entropy->zc = 0;
  entropy->ct = 11;
  entropy->buffer = -1;  /* empty */

  /* Initialize restart stuff */
  entropy->restarts_to_go = cinfo->restart_interval;
  entropy->next_restart_num = 0;
}